

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedColumnData::AppendInternal<false>
          (PartitionedColumnData *this,PartitionedColumnDataAppendState *state,DataChunk *input)

{
  DataChunk *this_00;
  _Hash_node_base _Var1;
  _Hash_node_base *p_Var2;
  sel_t *psVar3;
  _Hash_node_base _Var4;
  ulong uVar5;
  int iVar6;
  reference this_01;
  type this_02;
  reference this_03;
  type this_04;
  reference this_05;
  type state_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  __node_base *p_Var7;
  SelectionVector partition_sel;
  SelectionVector local_68;
  PartitionedColumnDataAppendState *local_50;
  vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
  *local_48;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_40;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *local_38;
  
  local_68.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.sel_vector = (sel_t *)0x0;
  local_68.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var7 = &(state->partition_entries)._M_h._M_before_begin;
  local_38 = &this->partitions;
  local_40 = &state->partition_buffers;
  local_48 = &state->partition_append_states;
  this_00 = &state->slice_chunk;
  local_50 = state;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var7[1]._M_nxt;
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
              ::get<true>(local_38,(size_type)_Var1._M_nxt);
    this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator*(this_01);
    this_03 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
              ::get<true>(local_40,(size_type)_Var1._M_nxt);
    this_04 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                        (this_03);
    this_05 = vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
              ::get<true>(local_48,(size_type)_Var1._M_nxt);
    state_00 = unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
               ::operator*(this_05);
    p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
    _Var1._M_nxt = p_Var7[3]._M_nxt;
    psVar3 = (local_50->partition_sel).sel_vector;
    ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
               &local_68.selection_data);
    _Var4._M_nxt = p_Var7[3]._M_nxt;
    local_68.sel_vector = psVar3 + ((long)p_Var2 - (long)_Var1._M_nxt);
    iVar6 = (*this->_vptr_PartitionedColumnData[2])(this);
    if (_Var4._M_nxt < (_Hash_node_base *)(CONCAT44(extraout_var,iVar6) >> 1)) {
      DataChunk::Append(this_04,input,false,&local_68,(idx_t)p_Var7[3]._M_nxt);
      uVar5 = this_04->count;
      iVar6 = (*this->_vptr_PartitionedColumnData[2])(this);
      if (CONCAT44(extraout_var_00,iVar6) >> 1 <= uVar5) {
        ColumnDataCollection::Append(this_02,state_00,this_04);
        DataChunk::Reset(this_04);
        iVar6 = (*this->_vptr_PartitionedColumnData[2])(this);
        this_04->capacity = CONCAT44(extraout_var_01,iVar6);
      }
    }
    else {
      DataChunk::Reset(this_00);
      DataChunk::Slice(this_00,input,&local_68,(idx_t)p_Var7[3]._M_nxt,0);
      ColumnDataCollection::Append(this_02,state_00,this_00);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PartitionedColumnData::AppendInternal(PartitionedColumnDataAppendState &state, DataChunk &input) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	const auto &partition_entries = state.GetMap<fixed>();

	// Loop through the partitions to append the new data to the partition buffers, and flush the buffers if necessary
	SelectionVector partition_sel;
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		const auto &partition_index = GETTER::GetKey(it);

		// Partition, buffer, and append state for this partition index
		auto &partition = *partitions[partition_index];
		auto &partition_buffer = *state.partition_buffers[partition_index];
		auto &partition_append_state = *state.partition_append_states[partition_index];

		// Length and offset into the selection vector for this chunk, for this partition
		const auto &partition_entry = GETTER::GetValue(it);
		const auto &partition_length = partition_entry.length;
		const auto partition_offset = partition_entry.offset - partition_length;

		// Create a selection vector for this partition using the offset into the single selection vector
		partition_sel.Initialize(state.partition_sel.data() + partition_offset);

		if (partition_length >= HalfBufferSize()) {
			// Slice the input chunk using the selection vector
			state.slice_chunk.Reset();
			state.slice_chunk.Slice(input, partition_sel, partition_length);

			// Append it to the partition directly
			partition.Append(partition_append_state, state.slice_chunk);
		} else {
			// Append the input chunk to the partition buffer using the selection vector
			partition_buffer.Append(input, false, &partition_sel, partition_length);

			if (partition_buffer.size() >= HalfBufferSize()) {
				// Next batch won't fit in the buffer, flush it to the partition
				partition.Append(partition_append_state, partition_buffer);
				partition_buffer.Reset();
				partition_buffer.SetCapacity(BufferSize());
			}
		}
	}
}